

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SyncNetworkData
          (Error *__return_storage_ptr__,CommissionerApp *this)

{
  bool bVar1;
  element_type *peVar2;
  Error *pEVar3;
  ErrorCode local_394;
  Error local_390;
  ErrorCode local_364;
  Error local_360;
  ErrorCode local_334;
  Error local_330;
  ErrorCode local_304;
  Error local_300;
  ErrorCode local_2d4;
  Error local_2d0;
  undefined1 local_2a8 [8];
  CommissionerDataset commDataset;
  BbrDataset bbrDataset;
  PendingOperationalDataset pendingDataset;
  undefined1 local_f8 [8];
  ActiveOperationalDataset activeDataset;
  CommissionerApp *this_local;
  Error *error;
  
  activeDataset._215_1_ = 0;
  Error::Error(__return_storage_ptr__);
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_f8);
  PendingOperationalDataset::PendingOperationalDataset
            ((PendingOperationalDataset *)&bbrDataset.mPresentFlags);
  BbrDataset::BbrDataset((BbrDataset *)&commDataset.mJoinerUdpPort);
  CommissionerDataset::CommissionerDataset((CommissionerDataset *)local_2a8);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar2->_vptr_Commissioner[0x1a])(&local_2d0,peVar2,local_f8,0xffff);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_2d0);
  local_2d4 = kNone;
  bVar1 = commissioner::operator!=(pEVar3,&local_2d4);
  Error::~Error(&local_2d0);
  if (!bVar1) {
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar2->_vptr_Commissioner[0x20])(&local_300,peVar2,&bbrDataset.mPresentFlags,0xffff);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_300);
    local_304 = kNone;
    bVar1 = commissioner::operator!=(pEVar3,&local_304);
    Error::~Error(&local_300);
    if (!bVar1) {
      peVar2 = std::
               __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mCommissioner);
      (*peVar2->_vptr_Commissioner[0x14])(&local_330,peVar2,&this->mCommDataset);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_330);
      local_334 = kNone;
      bVar1 = commissioner::operator!=(pEVar3,&local_334);
      Error::~Error(&local_330);
      if (!bVar1) {
        peVar2 = std::
                 __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mCommissioner);
        (*peVar2->_vptr_Commissioner[0x12])(&local_360,peVar2,local_2a8,0xffff);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_360);
        local_364 = kNone;
        bVar1 = commissioner::operator!=(pEVar3,&local_364);
        Error::~Error(&local_360);
        if (!bVar1) {
          MergeDataset(&this->mCommDataset,(CommissionerDataset *)local_2a8);
          bVar1 = IsCcmMode(this);
          if (bVar1) {
            peVar2 = std::
                     __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->mCommissioner);
            (*peVar2->_vptr_Commissioner[0x18])
                      (&local_390,peVar2,&commDataset.mJoinerUdpPort,0xffff);
            pEVar3 = Error::operator=(__return_storage_ptr__,&local_390);
            local_394 = kNone;
            bVar1 = commissioner::operator!=(pEVar3,&local_394);
            Error::~Error(&local_390);
            if (bVar1) goto LAB_001c9afb;
            BbrDataset::operator=(&this->mBbrDataset,(BbrDataset *)&commDataset.mJoinerUdpPort);
          }
          ActiveOperationalDataset::operator=
                    (&this->mActiveDataset,(ActiveOperationalDataset *)local_f8);
          PendingOperationalDataset::operator=
                    (&this->mPendingDataset,(PendingOperationalDataset *)&bbrDataset.mPresentFlags);
        }
      }
    }
  }
LAB_001c9afb:
  activeDataset._215_1_ = 1;
  CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_2a8);
  BbrDataset::~BbrDataset((BbrDataset *)&commDataset.mJoinerUdpPort);
  PendingOperationalDataset::~PendingOperationalDataset
            ((PendingOperationalDataset *)&bbrDataset.mPresentFlags);
  ActiveOperationalDataset::~ActiveOperationalDataset((ActiveOperationalDataset *)local_f8);
  if ((activeDataset._215_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SyncNetworkData(void)
{
    Error                     error;
    ActiveOperationalDataset  activeDataset;
    PendingOperationalDataset pendingDataset;
    BbrDataset                bbrDataset;
    CommissionerDataset       commDataset;

    SuccessOrExit(error = mCommissioner->GetActiveDataset(activeDataset, 0xFFFF));
    SuccessOrExit(error = mCommissioner->GetPendingDataset(pendingDataset, 0xFFFF));
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(mCommDataset));
    SuccessOrExit(error = mCommissioner->GetCommissionerDataset(commDataset, 0xFFFF));
    MergeDataset(mCommDataset, commDataset);

    if (IsCcmMode())
    {
        SuccessOrExit(error = mCommissioner->GetBbrDataset(bbrDataset, 0xFFFF));
        mBbrDataset = bbrDataset;
    }
    mActiveDataset  = activeDataset;
    mPendingDataset = pendingDataset;

exit:
    return error;
}